

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coinselector_tests.cpp
# Opt level: O0

void __thiscall wallet::coinselector_tests::SelectCoins_test::test_method(SelectCoins_test *this)

{
  long lVar1;
  result_type_conflict1 rVar2;
  CFeeRate effective_feerate;
  bool bVar3;
  CAmount *nTargetValue;
  CCoinControl *coin_control;
  long in_RDI;
  long in_FS_OFFSET;
  int j;
  CAmount balance;
  int i;
  CAmount target;
  CFeeRate rate;
  CAmount val;
  exponential_distribution<double> distribution;
  default_random_engine generator;
  unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_> wallet;
  CoinSelectionParams cs_params;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock15;
  Result<wallet::SelectionResult> result;
  CCoinControl cc;
  CoinsResult available_coins;
  FastRandomContext rand;
  char *in_stack_fffffffffffffa18;
  set<std::shared_ptr<wallet::COutput>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
  *this_00;
  CoinsResult *in_stack_fffffffffffffa20;
  FastRandomContext *in_stack_fffffffffffffa28;
  FastRandomContext *this_01;
  uint in_stack_fffffffffffffa34;
  _Optional_payload_base<int> in_stack_fffffffffffffa38;
  CFeeRate in_stack_fffffffffffffa40;
  CFeeRate in_stack_fffffffffffffa48;
  undefined7 in_stack_fffffffffffffa50;
  undefined1 in_stack_fffffffffffffa57;
  _Optional_payload_base<int> in_stack_fffffffffffffa58;
  char *in_stack_fffffffffffffa60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffa68;
  CCoinControl *in_stack_fffffffffffffa70;
  string *in_stack_fffffffffffffa80;
  NodeContext *in_stack_fffffffffffffa88;
  int tx_noinputs_size;
  undefined8 *in_stack_fffffffffffffa90;
  PreSelectedInputs *pre_set_inputs;
  undefined4 in_stack_fffffffffffffac8;
  int iVar4;
  CWallet *wallet_00;
  int local_528;
  _Optional_payload_base<int> local_510;
  undefined1 local_508 [10];
  undefined1 in_stack_fffffffffffffb02;
  undefined1 in_stack_fffffffffffffb03;
  int in_stack_fffffffffffffb04;
  CAmount *in_stack_fffffffffffffb08;
  CWallet *in_stack_fffffffffffffb10;
  CoinsResult *in_stack_fffffffffffffb18;
  lazy_ostream local_498 [2];
  assertion_result local_478;
  CFeeRate in_stack_fffffffffffffba0;
  CoinsResult *local_440;
  set<std::shared_ptr<wallet::COutput>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
  *local_438;
  undefined1 local_428 [55];
  undefined1 local_3f1 [9];
  _Optional_payload_base<int> local_3e8 [4];
  undefined8 local_3c8;
  undefined8 local_3b8;
  undefined8 local_378;
  undefined8 uStack_370;
  undefined8 local_368;
  undefined8 uStack_360;
  undefined8 local_358;
  undefined8 uStack_350;
  undefined8 local_348;
  int in_stack_fffffffffffffd90;
  int in_stack_fffffffffffffda0;
  undefined4 in_stack_fffffffffffffda4;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  nTargetValue = (CAmount *)(in_RDI + 0x10);
  pre_set_inputs = (PreSelectedInputs *)local_3f1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffa68,in_stack_fffffffffffffa60,
             (allocator<char> *)in_stack_fffffffffffffa58);
  NewWallet(in_stack_fffffffffffffa88,in_stack_fffffffffffffa80);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffa18);
  std::allocator<char>::~allocator((allocator<char> *)local_3f1);
  std::unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_>::operator->
            ((unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_> *)
             in_stack_fffffffffffffa18);
  coin_control = (CCoinControl *)
                 MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
                           ((AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffffa18);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_fffffffffffffa58,
             (AnnotatedMixin<std::recursive_mutex> *)
             CONCAT17(in_stack_fffffffffffffa57,in_stack_fffffffffffffa50),
             (char *)in_stack_fffffffffffffa48.nSatoshisPerK,
             (char *)in_stack_fffffffffffffa40.nSatoshisPerK,in_stack_fffffffffffffa38._4_4_,
             in_stack_fffffffffffffa38._M_payload._3_1_);
  std::linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>::
  linear_congruential_engine
            ((linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)
             in_stack_fffffffffffffa18);
  std::exponential_distribution<double>::exponential_distribution
            ((exponential_distribution<double> *)in_stack_fffffffffffffa18,6.94640290325867e-317);
  FastRandomContext::FastRandomContext
            (in_stack_fffffffffffffa28,SUB81((ulong)in_stack_fffffffffffffa20 >> 0x38,0));
  for (local_528 = 0; local_528 < 100; local_528 = local_528 + 1) {
    CoinsResult::CoinsResult(in_stack_fffffffffffffa20);
    wallet_00 = (CWallet *)0x0;
    this_01 = in_stack_fffffffffffffa28;
    for (iVar4 = 0; tx_noinputs_size = (int)in_stack_fffffffffffffa90, iVar4 < 1000;
        iVar4 = iVar4 + 1) {
      rVar2 = std::exponential_distribution<double>::operator()
                        ((exponential_distribution<double> *)this_01,
                         (linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)
                         in_stack_fffffffffffffa20);
      local_428._24_8_ = (undefined8)(rVar2 * 10000000.0);
      std::unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_>::operator*
                ((unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_> *)this_01);
      CFeeRate::CFeeRate<int>((CFeeRate *)in_stack_fffffffffffffa18,0);
      this_01 = (FastRandomContext *)((ulong)this_01 & 0xffffffff00000000);
      in_stack_fffffffffffffa20 =
           (CoinsResult *)((ulong)in_stack_fffffffffffffa20 & 0xffffffff00000000);
      in_stack_fffffffffffffa18 = (char *)((ulong)in_stack_fffffffffffffa18 & 0xffffffff00000000);
      add_coin(in_stack_fffffffffffffb18,in_stack_fffffffffffffb10,in_stack_fffffffffffffb08,
               in_stack_fffffffffffffba0,in_stack_fffffffffffffb04,(bool)in_stack_fffffffffffffb03,
               in_stack_fffffffffffffd90,(bool)in_stack_fffffffffffffb02,in_stack_fffffffffffffda0);
      wallet_00 = (CWallet *)
                  ((long)&(wallet_00->super_WalletStorage)._vptr_WalletStorage +
                  (long)(_Rb_tree_color *)local_428._24_8_);
    }
    RandomMixin<FastRandomContext>::randrange<int>
              ((RandomMixin<FastRandomContext> *)in_stack_fffffffffffffa40.nSatoshisPerK,
               in_stack_fffffffffffffa38._4_4_);
    CFeeRate::CFeeRate<int>((CFeeRate *)in_stack_fffffffffffffa18,0);
    local_428._0_8_ =
         RandomMixin<FastRandomContext>::randrange<long>
                   ((RandomMixin<FastRandomContext> *)in_stack_fffffffffffffa40.nSatoshisPerK,
                    (long)in_stack_fffffffffffffa38);
    local_428._0_8_ = local_428._0_8_ + 1000;
    CFeeRate::CFeeRate<int>((CFeeRate *)in_stack_fffffffffffffa18,0);
    CFeeRate::CFeeRate<int>((CFeeRate *)in_stack_fffffffffffffa18,0);
    CFeeRate::CFeeRate<int>((CFeeRate *)in_stack_fffffffffffffa18,0);
    std::optional<int>::optional((optional<int> *)local_3e8);
    in_stack_fffffffffffffa28 = (FastRandomContext *)((ulong)this_01 & 0xffffffff00000000);
    effective_feerate.nSatoshisPerK._7_1_ = in_stack_fffffffffffffa57;
    effective_feerate.nSatoshisPerK._0_7_ = in_stack_fffffffffffffa50;
    this_00 = local_438;
    in_stack_fffffffffffffa20 = local_440;
    in_stack_fffffffffffffa38 = local_3e8[0];
    CoinSelectionParams::CoinSelectionParams
              ((CoinSelectionParams *)local_3e8[0],
               (FastRandomContext *)((ulong)in_stack_fffffffffffffa34 << 0x20),
               (int)((ulong)this_01 >> 0x20),0,(CAmount)local_440,effective_feerate,
               in_stack_fffffffffffffa48,in_stack_fffffffffffffa40,tx_noinputs_size,
               SUB81((ulong)local_438 >> 0x38,0),(optional<int>)in_stack_fffffffffffffa58);
    local_3b8 = 1;
    local_3c8 = 1;
    CCoinControl::CCoinControl(in_stack_fffffffffffffa70);
    std::unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_>::operator*
              ((unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_> *)
               in_stack_fffffffffffffa28);
    local_358 = 0;
    uStack_350 = 0;
    local_368 = 0;
    uStack_360 = 0;
    local_378 = 0;
    uStack_370 = 0;
    in_stack_fffffffffffffa90 = &local_378;
    std::
    set<std::shared_ptr<wallet::COutput>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
    ::set(this_00);
    local_348 = 0;
    in_stack_fffffffffffffa18 = (char *)(local_3e8 + 1);
    SelectCoins(wallet_00,(CoinsResult *)CONCAT44(iVar4,in_stack_fffffffffffffac8),pre_set_inputs,
                nTargetValue,coin_control,
                (CoinSelectionParams *)CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0)
               );
    PreSelectedInputs::~PreSelectedInputs((PreSelectedInputs *)in_stack_fffffffffffffa18);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffffa28,
                 (pointer)in_stack_fffffffffffffa20,(unsigned_long)in_stack_fffffffffffffa18);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffffa18);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_fffffffffffffa58,
                 (const_string *)CONCAT17(in_stack_fffffffffffffa57,in_stack_fffffffffffffa50),
                 in_stack_fffffffffffffa48.nSatoshisPerK,
                 (const_string *)in_stack_fffffffffffffa40.nSatoshisPerK);
      boost::test_tools::assertion_result::assertion_result<util::Result<wallet::SelectionResult>>
                ((assertion_result *)in_stack_fffffffffffffa28,
                 (Result<wallet::SelectionResult> *)in_stack_fffffffffffffa20);
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffffa28,
                 (pointer)in_stack_fffffffffffffa20,(unsigned_long)in_stack_fffffffffffffa18);
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_fffffffffffffa20,
                 (basic_cstring<const_char> *)in_stack_fffffffffffffa18);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffffa28,
                 (pointer)in_stack_fffffffffffffa20,(unsigned_long)in_stack_fffffffffffffa18);
      in_stack_fffffffffffffa18 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (&local_478,local_498,(const_string *)&stack0xfffffffffffffb48,0x365,CHECK,
                 CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)in_stack_fffffffffffffa18);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_fffffffffffffa18);
      bVar3 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar3);
    do {
      in_stack_fffffffffffffa70 = boost::unit_test::(anonymous_namespace)::unit_test_log;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffffa28,
                 (pointer)in_stack_fffffffffffffa20,(unsigned_long)in_stack_fffffffffffffa18);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffffa18);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_fffffffffffffa58,
                 (const_string *)CONCAT17(in_stack_fffffffffffffa57,in_stack_fffffffffffffa50),
                 in_stack_fffffffffffffa48.nSatoshisPerK,
                 (const_string *)in_stack_fffffffffffffa40.nSatoshisPerK);
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_fffffffffffffa20,(char (*) [1])in_stack_fffffffffffffa18);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffffa28,
                 (pointer)in_stack_fffffffffffffa20,(unsigned_long)in_stack_fffffffffffffa18);
      util::Result<wallet::SelectionResult>::operator->
                ((Result<wallet::SelectionResult> *)in_stack_fffffffffffffa18);
      in_stack_fffffffffffffa58 =
           (_Optional_payload_base<int>)
           SelectionResult::GetSelectedValue((SelectionResult *)in_stack_fffffffffffffa38);
      in_stack_fffffffffffffa28 = (FastRandomContext *)0x1d27ed5;
      in_stack_fffffffffffffa20 = (CoinsResult *)local_428;
      in_stack_fffffffffffffa18 = "result->GetSelectedValue()";
      local_510 = in_stack_fffffffffffffa58;
      boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::ge_impl,long,long>
                (&stack0xfffffffffffffb08,local_508,0x366,1,7,&local_510);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                          *)in_stack_fffffffffffffa18);
      in_stack_fffffffffffffa57 = boost::test_tools::tt_detail::dummy_cond();
    } while ((bool)in_stack_fffffffffffffa57);
    util::Result<wallet::SelectionResult>::~Result
              ((Result<wallet::SelectionResult> *)in_stack_fffffffffffffa18);
    CCoinControl::~CCoinControl((CCoinControl *)in_stack_fffffffffffffa18);
    CoinsResult::~CoinsResult((CoinsResult *)in_stack_fffffffffffffa18);
  }
  FastRandomContext::~FastRandomContext((FastRandomContext *)in_stack_fffffffffffffa18);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_fffffffffffffa18);
  std::unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_>::~unique_ptr
            ((unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_> *)
             in_stack_fffffffffffffa28);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(SelectCoins_test)
{
    std::unique_ptr<CWallet> wallet = NewWallet(m_node);
    LOCK(wallet->cs_wallet); // Every 'SelectCoins' call requires it

    // Random generator stuff
    std::default_random_engine generator;
    std::exponential_distribution<double> distribution (100);
    FastRandomContext rand;

    // Run this test 100 times
    for (int i = 0; i < 100; ++i)
    {
        CoinsResult available_coins;
        CAmount balance{0};

        // Make a wallet with 1000 exponentially distributed random inputs
        for (int j = 0; j < 1000; ++j)
        {
            CAmount val = distribution(generator)*10000000;
            add_coin(available_coins, *wallet, val);
            balance += val;
        }

        // Generate a random fee rate in the range of 100 - 400
        CFeeRate rate(rand.randrange(300) + 100);

        // Generate a random target value between 1000 and wallet balance
        CAmount target = rand.randrange(balance - 1000) + 1000;

        // Perform selection
        CoinSelectionParams cs_params{
            rand,
            /*change_output_size=*/ 34,
            /*change_spend_size=*/ 148,
            /*min_change_target=*/ CENT,
            /*effective_feerate=*/ CFeeRate(0),
            /*long_term_feerate=*/ CFeeRate(0),
            /*discard_feerate=*/ CFeeRate(0),
            /*tx_noinputs_size=*/ 0,
            /*avoid_partial=*/ false,
        };
        cs_params.m_cost_of_change = 1;
        cs_params.min_viable_change = 1;
        CCoinControl cc;
        const auto result = SelectCoins(*wallet, available_coins, /*pre_set_inputs=*/{}, target, cc, cs_params);
        BOOST_CHECK(result);
        BOOST_CHECK_GE(result->GetSelectedValue(), target);
    }
}